

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateParsingConstructor
          (ImmutableMessageGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  FieldDescriptor *this_00;
  bool bVar2;
  int iVar3;
  Type TVar4;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *this_01;
  ImmutableFieldGenerator *pIVar5;
  FieldDescriptor **ppFVar6;
  int i_00;
  int i_01;
  ulong uVar7;
  ulong extraout_RDX;
  int iVar8;
  char *text;
  int i_1;
  java *this_02;
  long lVar9;
  int i;
  long lVar10;
  scoped_array<const_google::protobuf::FieldDescriptor_*> sorted_fields;
  string local_50;
  
  sorted_fields.array_ = SortFieldsByNumber((this->super_MessageGenerator).descriptor_);
  io::Printer::Print(printer,
                     "private $classname$(\n    com.google.protobuf.CodedInputStream input,\n    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n    throws com.google.protobuf.InvalidProtocolBufferException {\n"
                     ,"classname",*(string **)(this->super_MessageGenerator).descriptor_);
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"this();\n");
  this_01 = &this->field_generators_;
  lVar9 = 0;
  iVar8 = 0;
  for (lVar10 = 0; pDVar1 = (this->super_MessageGenerator).descriptor_,
      lVar10 < *(int *)(pDVar1 + 0x2c); lVar10 = lVar10 + 1) {
    pIVar5 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                       (this_01,(FieldDescriptor *)(*(long *)(pDVar1 + 0x30) + lVar9));
    iVar3 = (*pIVar5->_vptr_ImmutableFieldGenerator[3])(pIVar5);
    iVar8 = iVar8 + iVar3;
    lVar9 = lVar9 + 0xa8;
  }
  iVar3 = (iVar8 + 0x1f) / 0x20;
  uVar7 = (long)(iVar8 + 0x1f) % 0x20 & 0xffffffff;
  this_02 = (java *)0x0;
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  for (; iVar3 != (int)this_02; this_02 = (java *)(ulong)((int)this_02 + 1)) {
    GetBitFieldName_abi_cxx11_(&local_50,this_02,(int)uVar7);
    io::Printer::Print(printer,"int mutable_$bit_field_name$ = 0;\n","bit_field_name",&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    uVar7 = extraout_RDX;
  }
  if (*(int *)(*(long *)((this->super_MessageGenerator).descriptor_ + 0x10) + 0x8c) != 3) {
    io::Printer::Print(printer,
                       "com.google.protobuf.UnknownFieldSet.Builder unknownFields =\n    com.google.protobuf.UnknownFieldSet.newBuilder();\n"
                      );
  }
  io::Printer::Print(printer,"try {\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"boolean done = false;\nwhile (!done) {\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"int tag = input.readTag();\nswitch (tag) {\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,"case 0:\n  done = true;\n  break;\n");
  text = 
  "default: {\n  if (!parseUnknownField(input, unknownFields,\n                         extensionRegistry, tag)) {\n    done = true;\n  }\n  break;\n}\n"
  ;
  if (*(int *)(*(long *)((this->super_MessageGenerator).descriptor_ + 0x10) + 0x8c) == 3) {
    text = "default: {\n  if (!input.skipField(tag)) {\n    done = true;\n  }\n  break;\n}\n";
  }
  io::Printer::Print(printer,text);
  for (lVar9 = 0; lVar9 < *(int *)((this->super_MessageGenerator).descriptor_ + 0x2c);
      lVar9 = lVar9 + 1) {
    ppFVar6 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                        (&sorted_fields,lVar9);
    this_00 = *ppFVar6;
    iVar8 = *(int *)(this_00 + 0x38);
    TVar4 = FieldDescriptor::type(this_00);
    SimpleItoa_abi_cxx11_
              (&local_50,
               (protobuf *)
               (ulong)(iVar8 << 3 |
                      *(uint *)(internal::WireFormatLite::kWireTypeForFieldType + (ulong)TVar4 * 4))
               ,i_00);
    io::Printer::Print(printer,"case $tag$: {\n","tag",&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    io::Printer::Indent(printer);
    pIVar5 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                       (this_01,this_00);
    (*pIVar5->_vptr_ImmutableFieldGenerator[0xb])(pIVar5,printer);
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"  break;\n}\n");
    bVar2 = FieldDescriptor::is_packable(this_00);
    if (bVar2) {
      SimpleItoa_abi_cxx11_(&local_50,(protobuf *)(ulong)(*(int *)(this_00 + 0x38) * 8 + 2),i_01);
      io::Printer::Print(printer,"case $tag$: {\n","tag",&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      io::Printer::Indent(printer);
      pIVar5 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                         (this_01,this_00);
      (*pIVar5->_vptr_ImmutableFieldGenerator[0xc])(pIVar5,printer);
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"  break;\n}\n");
    }
  }
  io::Printer::Outdent(printer);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"  }\n}\n");
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,
                     "} catch (com.google.protobuf.InvalidProtocolBufferException e) {\n  throw e.setUnfinishedMessage(this);\n} catch (java.io.IOException e) {\n  throw new com.google.protobuf.InvalidProtocolBufferException(\n      e).setUnfinishedMessage(this);\n} finally {\n"
                    );
  io::Printer::Indent(printer);
  for (lVar9 = 0; pDVar1 = (this->super_MessageGenerator).descriptor_,
      lVar9 < *(int *)(pDVar1 + 0x2c); lVar9 = lVar9 + 1) {
    ppFVar6 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                        (&sorted_fields,lVar9);
    pIVar5 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                       (this_01,*ppFVar6);
    (*pIVar5->_vptr_ImmutableFieldGenerator[0xd])(pIVar5,printer);
  }
  if (*(int *)(*(long *)(pDVar1 + 0x10) + 0x8c) != 3) {
    io::Printer::Print(printer,"this.unknownFields = unknownFields.build();\n");
  }
  io::Printer::Print(printer,"makeExtensionsImmutable();\n");
  io::Printer::Outdent(printer);
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"  }\n}\n");
  internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::~scoped_array(&sorted_fields);
  return;
}

Assistant:

void ImmutableMessageGenerator::
GenerateParsingConstructor(io::Printer* printer) {
  google::protobuf::scoped_array<const FieldDescriptor * > sorted_fields(
      SortFieldsByNumber(descriptor_));

  printer->Print(
      "private $classname$(\n"
      "    com.google.protobuf.CodedInputStream input,\n"
      "    com.google.protobuf.ExtensionRegistryLite extensionRegistry)\n"
      "    throws com.google.protobuf.InvalidProtocolBufferException {\n",
      "classname", descriptor_->name());
  printer->Indent();

  // Initialize all fields to default.
  printer->Print(
      "this();\n");

  // Use builder bits to track mutable repeated fields.
  int totalBuilderBits = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const ImmutableFieldGenerator& field =
        field_generators_.get(descriptor_->field(i));
    totalBuilderBits += field.GetNumBitsForBuilder();
  }
  int totalBuilderInts = (totalBuilderBits + 31) / 32;
  for (int i = 0; i < totalBuilderInts; i++) {
    printer->Print("int mutable_$bit_field_name$ = 0;\n",
      "bit_field_name", GetBitFieldName(i));
  }

  if (PreserveUnknownFields(descriptor_)) {
    printer->Print(
      "com.google.protobuf.UnknownFieldSet.Builder unknownFields =\n"
      "    com.google.protobuf.UnknownFieldSet.newBuilder();\n");
  }

  printer->Print(
      "try {\n");
  printer->Indent();

  printer->Print(
    "boolean done = false;\n"
    "while (!done) {\n");
  printer->Indent();

  printer->Print(
    "int tag = input.readTag();\n"
    "switch (tag) {\n");
  printer->Indent();

  printer->Print(
    "case 0:\n"          // zero signals EOF / limit reached
    "  done = true;\n"
    "  break;\n");

  if (PreserveUnknownFields(descriptor_)) {
    printer->Print(
      "default: {\n"
      "  if (!parseUnknownField(input, unknownFields,\n"
      "                         extensionRegistry, tag)) {\n"
      "    done = true;\n"  // it's an endgroup tag
      "  }\n"
      "  break;\n"
      "}\n");
  } else {
    printer->Print(
      "default: {\n"
      "  if (!input.skipField(tag)) {\n"
      "    done = true;\n"  // it's an endgroup tag
      "  }\n"
      "  break;\n"
      "}\n");
  }

  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = sorted_fields[i];
    uint32 tag = WireFormatLite::MakeTag(field->number(),
      WireFormat::WireTypeForFieldType(field->type()));

    printer->Print(
      "case $tag$: {\n",
      "tag", SimpleItoa(static_cast<int32>(tag)));
    printer->Indent();

    field_generators_.get(field).GenerateParsingCode(printer);

    printer->Outdent();
    printer->Print(
      "  break;\n"
      "}\n");

    if (field->is_packable()) {
      // To make packed = true wire compatible, we generate parsing code from a
      // packed version of this field regardless of field->options().packed().
      uint32 packed_tag = WireFormatLite::MakeTag(field->number(),
        WireFormatLite::WIRETYPE_LENGTH_DELIMITED);
      printer->Print(
        "case $tag$: {\n",
        "tag", SimpleItoa(static_cast<int32>(packed_tag)));
      printer->Indent();

      field_generators_.get(field).GenerateParsingCodeFromPacked(printer);

      printer->Outdent();
      printer->Print(
        "  break;\n"
        "}\n");
    }
  }

  printer->Outdent();
  printer->Outdent();
  printer->Print(
      "  }\n"     // switch (tag)
      "}\n");     // while (!done)

  printer->Outdent();
  printer->Print(
      "} catch (com.google.protobuf.InvalidProtocolBufferException e) {\n"
      "  throw e.setUnfinishedMessage(this);\n"
      "} catch (java.io.IOException e) {\n"
      "  throw new com.google.protobuf.InvalidProtocolBufferException(\n"
      "      e).setUnfinishedMessage(this);\n"
      "} finally {\n");
  printer->Indent();

  // Make repeated field list immutable.
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = sorted_fields[i];
    field_generators_.get(field).GenerateParsingDoneCode(printer);
  }

  if (PreserveUnknownFields(descriptor_)) {
    // Make unknown fields immutable.
    printer->Print("this.unknownFields = unknownFields.build();\n");
  }

  // Make extensions immutable.
  printer->Print(
      "makeExtensionsImmutable();\n");

  printer->Outdent();
  printer->Outdent();
  printer->Print(
      "  }\n"     // finally
      "}\n");
}